

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O2

double RLGamma(double a,double x)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  runtime_error *this;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 in_XMM17 [16];
  
  dVar7 = 0.0;
  if ((0.0 <= a) && (0.0 <= x)) {
    if ((x != 0.0) || (NAN(x))) {
      auVar15._0_8_ = log(x);
      auVar15._8_56_ = extraout_var;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = a;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = x;
      auVar6 = vfmsub213sd_fma(auVar15._0_16_,auVar9,auVar6);
      dVar7 = lgamma(a);
      dVar7 = auVar6._0_8_ - dVar7;
      if (-709.782712893384 <= dVar7) {
        dVar12 = 1.0;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = x;
        if ((x <= 1.0) || (x <= a)) {
          dVar20 = 1.0;
          dVar2 = a;
          do {
            dVar2 = dVar2 + 1.0;
            dVar12 = (x * dVar12) / dVar2;
            dVar20 = dVar20 + dVar12;
          } while (1e-15 < dVar12 / dVar20);
          dVar7 = exp(dVar7);
          dVar7 = (dVar7 * dVar20) / a;
        }
        else {
          auVar10 = ZEXT816(0x3ff0000000000000);
          dVar2 = 1.0 - a;
          auVar15 = ZEXT864((ulong)(x + 1.0));
          dVar12 = x + dVar2 + 1.0;
          auVar18 = ZEXT864((ulong)(x * dVar12));
          auVar14._8_8_ = 0;
          auVar14._0_8_ = x + 1.0;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = x * dVar12;
          auVar6 = vdivsd_avx512f(auVar14,auVar16);
          auVar29 = ZEXT1664(auVar6);
          iVar5 = 1;
          auVar19._8_8_ = 0x7fffffffffffffff;
          auVar19._0_8_ = 0x7fffffffffffffff;
          do {
            auVar6 = vcvtsi2sd_avx512f(in_XMM17,iVar5);
            dVar2 = dVar2 + 1.0;
            dVar12 = dVar12 + 2.0;
            dVar20 = auVar6._0_8_ * dVar2;
            dVar23 = auVar10._0_8_;
            dVar27 = auVar17._0_8_;
            auVar13._8_8_ = 0;
            auVar13._0_8_ = dVar12;
            auVar17 = auVar18._0_16_;
            auVar24._8_8_ = 0;
            auVar24._0_8_ = dVar20 * dVar27;
            auVar25 = vfmsub231sd_fma(auVar24,auVar17,auVar13);
            auVar10 = auVar15._0_16_;
            auVar21._8_8_ = 0;
            auVar21._0_8_ = dVar20 * dVar23;
            auVar22 = vfmsub231sd_fma(auVar21,auVar10,auVar13);
            dVar23 = auVar25._0_8_;
            dVar20 = auVar22._0_8_;
            if ((dVar23 != 0.0) || (NAN(dVar23))) {
              auVar26._0_8_ = dVar20 / dVar23;
              auVar26._8_8_ = auVar22._8_8_;
              auVar6 = vsubsd_avx512f(auVar29._0_16_,auVar26);
              auVar29 = ZEXT1664(auVar26);
              auVar28._0_8_ = auVar6._0_8_ / auVar26._0_8_;
              auVar28._8_8_ = auVar6._8_8_;
              auVar6 = vandpd_avx(auVar28,auVar19);
              bVar4 = 1e-15 < auVar6._0_8_;
            }
            else {
              bVar4 = true;
            }
            auVar6 = vandpd_avx(auVar22,auVar19);
            if (4503599627370496.0 < auVar6._0_8_) {
              auVar10._8_8_ = 0;
              auVar10._0_8_ = auVar15._0_8_ * 2.220446049250313e-16;
              auVar22._8_8_ = 0;
              auVar22._0_8_ = dVar20 * 2.220446049250313e-16;
              auVar17._8_8_ = 0;
              auVar17._0_8_ = auVar18._0_8_ * 2.220446049250313e-16;
              auVar25._8_8_ = 0;
              auVar25._0_8_ = dVar23 * 2.220446049250313e-16;
            }
            iVar5 = iVar5 + 1;
            auVar15 = ZEXT1664(auVar22);
            auVar18 = ZEXT1664(auVar25);
          } while (bVar4);
          vmovsd_avx512f(auVar29._0_16_);
          auVar18._0_8_ = exp(dVar7);
          auVar18._8_56_ = extraout_var_00;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = a;
          auVar6 = vfnmadd213sd_fma(auVar18._0_16_,auVar11,ZEXT816(0x3ff0000000000000));
          dVar7 = auVar6._0_8_;
        }
      }
      else {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = a;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = x;
        uVar3 = vcmpsd_avx512f(auVar8,auVar1,1);
        dVar7 = (double)((ulong)((byte)uVar3 & 1) * 0x3ff0000000000000);
      }
    }
    return dVar7;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"LLGamma: invalid arguments range!");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double RLGamma(double a, double x) {
    const double epsilon = 0.000000000000001;
    const double big = 4503599627370496.0;
    const double bigInv = 2.22044604925031308085e-16;
    if (a < 0 || x < 0)
        throw std::runtime_error("LLGamma: invalid arguments range!");

    if (x == 0)
        return 0.0f;

    double ax = (a * std::log(x)) - x - std::lgamma(a);
    if (ax < -709.78271289338399)
        return a < x ? 1.0 : 0.0;

    if (x <= 1 || x <= a) {
        double r2 = a;
        double c2 = 1;
        double ans2 = 1;

        do {
            r2 = r2 + 1;
            c2 = c2 * x / r2;
            ans2 += c2;
        } while ((c2 / ans2) > epsilon);

        return std::exp(ax) * ans2 / a;
    }

    int c = 0;
    double y = 1 - a;
    double z = x + y + 1;
    double p3 = 1;
    double q3 = x;
    double p2 = x + 1;
    double q2 = z * x;
    double ans = p2 / q2;
    double error;

    do {
        c++;
        y += 1;
        z += 2;
        double yc = y * c;
        double p = (p2 * z) - (p3 * yc);
        double q = (q2 * z) - (q3 * yc);

        if (q != 0) {
            double nextans = p / q;
            error = std::abs((ans - nextans) / nextans);
            ans = nextans;
        } else {
            // zero div, skip
            error = 1;
        }

        // shift
        p3 = p2;
        p2 = p;
        q3 = q2;
        q2 = q;

        // normalize fraction when the numerator becomes large
        if (std::abs(p) > big) {
            p3 *= bigInv;
            p2 *= bigInv;
            q3 *= bigInv;
            q2 *= bigInv;
        }
    } while (error > epsilon);

    return 1.0 - (std::exp(ax) * ans);
}